

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

string * __thiscall
wallet::(anonymous_namespace)::WalletImpl::getWalletName_abi_cxx11_(WalletImpl *this)

{
  long lVar1;
  CWallet *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000020;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_RDI);
  CWallet::GetName_abi_cxx11_(in_RDI);
  std::__cxx11::string::string(in_stack_00000020,in_stack_00000018);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (string *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string getWalletName() override { return m_wallet->GetName(); }